

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_listener.cpp
# Opt level: O2

int __thiscall
zmq::tcp_listener_t::accept(tcp_listener_t *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  uint __errnum;
  pointer ptVar1;
  pointer ptVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  char *errmsg_;
  uint *puVar7;
  long lVar8;
  undefined8 uVar9;
  long lVar10;
  socklen_t ss_len;
  sockaddr_storage ss;
  
  iVar4 = (this->super_stream_listener_base_t)._s;
  if (iVar4 == -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s != retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_listener.cpp"
            ,0xc3);
    fflush(_stderr);
    zmq_abort("_s != retired_fd");
    iVar4 = (this->super_stream_listener_base_t)._s;
  }
  ss.__ss_padding[0x6e] = '\0';
  ss.__ss_padding[0x6f] = '\0';
  ss.__ss_padding[0x70] = '\0';
  ss.__ss_padding[0x71] = '\0';
  ss.__ss_padding[0x72] = '\0';
  ss.__ss_padding[0x73] = '\0';
  ss.__ss_padding[0x74] = '\0';
  ss.__ss_padding[0x75] = '\0';
  ss.__ss_align = 0;
  ss.__ss_padding[0x5e] = '\0';
  ss.__ss_padding[0x5f] = '\0';
  ss.__ss_padding[0x60] = '\0';
  ss.__ss_padding[0x61] = '\0';
  ss.__ss_padding[0x62] = '\0';
  ss.__ss_padding[99] = '\0';
  ss.__ss_padding[100] = '\0';
  ss.__ss_padding[0x65] = '\0';
  ss.__ss_padding[0x66] = '\0';
  ss.__ss_padding[0x67] = '\0';
  ss.__ss_padding[0x68] = '\0';
  ss.__ss_padding[0x69] = '\0';
  ss.__ss_padding[0x6a] = '\0';
  ss.__ss_padding[0x6b] = '\0';
  ss.__ss_padding[0x6c] = '\0';
  ss.__ss_padding[0x6d] = '\0';
  ss.__ss_padding[0x4e] = '\0';
  ss.__ss_padding[0x4f] = '\0';
  ss.__ss_padding[0x50] = '\0';
  ss.__ss_padding[0x51] = '\0';
  ss.__ss_padding[0x52] = '\0';
  ss.__ss_padding[0x53] = '\0';
  ss.__ss_padding[0x54] = '\0';
  ss.__ss_padding[0x55] = '\0';
  ss.__ss_padding[0x56] = '\0';
  ss.__ss_padding[0x57] = '\0';
  ss.__ss_padding[0x58] = '\0';
  ss.__ss_padding[0x59] = '\0';
  ss.__ss_padding[0x5a] = '\0';
  ss.__ss_padding[0x5b] = '\0';
  ss.__ss_padding[0x5c] = '\0';
  ss.__ss_padding[0x5d] = '\0';
  ss.__ss_padding[0x3e] = '\0';
  ss.__ss_padding[0x3f] = '\0';
  ss.__ss_padding[0x40] = '\0';
  ss.__ss_padding[0x41] = '\0';
  ss.__ss_padding[0x42] = '\0';
  ss.__ss_padding[0x43] = '\0';
  ss.__ss_padding[0x44] = '\0';
  ss.__ss_padding[0x45] = '\0';
  ss.__ss_padding[0x46] = '\0';
  ss.__ss_padding[0x47] = '\0';
  ss.__ss_padding[0x48] = '\0';
  ss.__ss_padding[0x49] = '\0';
  ss.__ss_padding[0x4a] = '\0';
  ss.__ss_padding[0x4b] = '\0';
  ss.__ss_padding[0x4c] = '\0';
  ss.__ss_padding[0x4d] = '\0';
  ss.__ss_padding[0x2e] = '\0';
  ss.__ss_padding[0x2f] = '\0';
  ss.__ss_padding[0x30] = '\0';
  ss.__ss_padding[0x31] = '\0';
  ss.__ss_padding[0x32] = '\0';
  ss.__ss_padding[0x33] = '\0';
  ss.__ss_padding[0x34] = '\0';
  ss.__ss_padding[0x35] = '\0';
  ss.__ss_padding[0x36] = '\0';
  ss.__ss_padding[0x37] = '\0';
  ss.__ss_padding[0x38] = '\0';
  ss.__ss_padding[0x39] = '\0';
  ss.__ss_padding[0x3a] = '\0';
  ss.__ss_padding[0x3b] = '\0';
  ss.__ss_padding[0x3c] = '\0';
  ss.__ss_padding[0x3d] = '\0';
  ss.__ss_padding[0x1e] = '\0';
  ss.__ss_padding[0x1f] = '\0';
  ss.__ss_padding[0x20] = '\0';
  ss.__ss_padding[0x21] = '\0';
  ss.__ss_padding[0x22] = '\0';
  ss.__ss_padding[0x23] = '\0';
  ss.__ss_padding[0x24] = '\0';
  ss.__ss_padding[0x25] = '\0';
  ss.__ss_padding[0x26] = '\0';
  ss.__ss_padding[0x27] = '\0';
  ss.__ss_padding[0x28] = '\0';
  ss.__ss_padding[0x29] = '\0';
  ss.__ss_padding[0x2a] = '\0';
  ss.__ss_padding[0x2b] = '\0';
  ss.__ss_padding[0x2c] = '\0';
  ss.__ss_padding[0x2d] = '\0';
  ss.__ss_padding[0xe] = '\0';
  ss.__ss_padding[0xf] = '\0';
  ss.__ss_padding[0x10] = '\0';
  ss.__ss_padding[0x11] = '\0';
  ss.__ss_padding[0x12] = '\0';
  ss.__ss_padding[0x13] = '\0';
  ss.__ss_padding[0x14] = '\0';
  ss.__ss_padding[0x15] = '\0';
  ss.__ss_padding[0x16] = '\0';
  ss.__ss_padding[0x17] = '\0';
  ss.__ss_padding[0x18] = '\0';
  ss.__ss_padding[0x19] = '\0';
  ss.__ss_padding[0x1a] = '\0';
  ss.__ss_padding[0x1b] = '\0';
  ss.__ss_padding[0x1c] = '\0';
  ss.__ss_padding[0x1d] = '\0';
  ss.ss_family = 0;
  ss.__ss_padding[0] = '\0';
  ss.__ss_padding[1] = '\0';
  ss.__ss_padding[2] = '\0';
  ss.__ss_padding[3] = '\0';
  ss.__ss_padding[4] = '\0';
  ss.__ss_padding[5] = '\0';
  ss.__ss_padding[6] = '\0';
  ss.__ss_padding[7] = '\0';
  ss.__ss_padding[8] = '\0';
  ss.__ss_padding[9] = '\0';
  ss.__ss_padding[10] = '\0';
  ss.__ss_padding[0xb] = '\0';
  ss.__ss_padding[0xc] = '\0';
  ss.__ss_padding[0xd] = '\0';
  ss_len = 0x80;
  iVar4 = accept4(iVar4,(sockaddr *)&ss,&ss_len,0x80000);
  if (iVar4 == -1) {
    puVar7 = (uint *)__errno_location();
    __errnum = *puVar7;
    if ((__errnum < 0x19) && ((0x1801810U >> (__errnum & 0x1f) & 1) != 0)) {
      return -1;
    }
    if ((__errnum - 0x47 < 0x23) && ((0x500000001U >> ((ulong)(__errnum - 0x47) & 0x3f) & 1) != 0))
    {
      return -1;
    }
    errmsg_ = strerror(__errnum);
    uVar9 = 0xe2;
  }
  else {
    make_socket_noninheritable(iVar4);
    ptVar1 = (this->super_stream_listener_base_t).super_own_t.options.tcp_accept_filters.
             super__Vector_base<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ptVar2 = *(pointer *)
              ((long)&(this->super_stream_listener_base_t).super_own_t.options.tcp_accept_filters.
                      super__Vector_base<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>
                      ._M_impl.super__Vector_impl_data + 8);
    if (ptVar1 != ptVar2) {
      lVar10 = ((long)ptVar2 - (long)ptVar1 >> 5) + 1;
      lVar8 = 0;
      do {
        lVar10 = lVar10 + -1;
        if (lVar10 == 0) {
          iVar4 = close(iVar4);
          if (iVar4 == 0) {
            return -1;
          }
          piVar6 = __errno_location();
          errmsg_ = strerror(*piVar6);
          uVar9 = 0xfb;
          goto LAB_001b5f42;
        }
        bVar3 = tcp_address_mask_t::match_address
                          ((tcp_address_mask_t *)
                           ((long)&((this->super_stream_listener_base_t).super_own_t.options.
                                    tcp_accept_filters.
                                    super__Vector_base<zmq::tcp_address_mask_t,_std::allocator<zmq::tcp_address_mask_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_network_address +
                           lVar8),(sockaddr *)&ss,ss_len);
        lVar8 = lVar8 + 0x20;
      } while (!bVar3);
    }
    iVar5 = set_nosigpipe(iVar4);
    if (iVar5 == 0) {
      iVar5 = (this->super_stream_listener_base_t).super_own_t.options.tos;
      if (iVar5 != 0) {
        set_ip_type_of_service(iVar4,iVar5);
      }
      iVar5 = (this->super_stream_listener_base_t).super_own_t.options.priority;
      if (iVar5 == 0) {
        return iVar4;
      }
      set_socket_priority(iVar4,iVar5);
      return iVar4;
    }
    iVar4 = close(iVar4);
    if (iVar4 == 0) {
      return -1;
    }
    piVar6 = __errno_location();
    errmsg_ = strerror(*piVar6);
    uVar9 = 0x107;
  }
LAB_001b5f42:
  fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_listener.cpp"
          ,uVar9);
  fflush(_stderr);
  zmq_abort(errmsg_);
  return -1;
}

Assistant:

zmq::fd_t zmq::tcp_listener_t::accept ()
{
    //  The situation where connection cannot be accepted due to insufficient
    //  resources is considered valid and treated by ignoring the connection.
    //  Accept one connection and deal with different failure modes.
    zmq_assert (_s != retired_fd);

    struct sockaddr_storage ss;
    memset (&ss, 0, sizeof (ss));
#if defined ZMQ_HAVE_HPUX || defined ZMQ_HAVE_VXWORKS
    int ss_len = sizeof (ss);
#else
    socklen_t ss_len = sizeof (ss);
#endif
#if defined ZMQ_HAVE_SOCK_CLOEXEC && defined HAVE_ACCEPT4
    fd_t sock = ::accept4 (_s, reinterpret_cast<struct sockaddr *> (&ss),
                           &ss_len, SOCK_CLOEXEC);
#else
    const fd_t sock =
      ::accept (_s, reinterpret_cast<struct sockaddr *> (&ss), &ss_len);
#endif

    if (sock == retired_fd) {
#if defined ZMQ_HAVE_WINDOWS
        const int last_error = WSAGetLastError ();
        wsa_assert (last_error == WSAEWOULDBLOCK || last_error == WSAECONNRESET
                    || last_error == WSAEMFILE || last_error == WSAENOBUFS);
#elif defined ZMQ_HAVE_ANDROID
        errno_assert (errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR
                      || errno == ECONNABORTED || errno == EPROTO
                      || errno == ENOBUFS || errno == ENOMEM || errno == EMFILE
                      || errno == ENFILE || errno == EINVAL);
#else
        errno_assert (errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR
                      || errno == ECONNABORTED || errno == EPROTO
                      || errno == ENOBUFS || errno == ENOMEM || errno == EMFILE
                      || errno == ENFILE);
#endif
        return retired_fd;
    }

    make_socket_noninheritable (sock);

    if (!options.tcp_accept_filters.empty ()) {
        bool matched = false;
        for (options_t::tcp_accept_filters_t::size_type
               i = 0,
               size = options.tcp_accept_filters.size ();
             i != size; ++i) {
            if (options.tcp_accept_filters[i].match_address (
                  reinterpret_cast<struct sockaddr *> (&ss), ss_len)) {
                matched = true;
                break;
            }
        }
        if (!matched) {
#ifdef ZMQ_HAVE_WINDOWS
            const int rc = closesocket (sock);
            wsa_assert (rc != SOCKET_ERROR);
#else
            int rc = ::close (sock);
            errno_assert (rc == 0);
#endif
            return retired_fd;
        }
    }

    if (zmq::set_nosigpipe (sock)) {
#ifdef ZMQ_HAVE_WINDOWS
        const int rc = closesocket (sock);
        wsa_assert (rc != SOCKET_ERROR);
#else
        int rc = ::close (sock);
        errno_assert (rc == 0);
#endif
        return retired_fd;
    }

    // Set the IP Type-Of-Service priority for this client socket
    if (options.tos != 0)
        set_ip_type_of_service (sock, options.tos);

    // Set the protocol-defined priority for this client socket
    if (options.priority != 0)
        set_socket_priority (sock, options.priority);

    return sock;
}